

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib518.c
# Opt level: O1

void close_file_descriptors(void)

{
  num_open_0 = 0;
  if (num_open_1 != 0) {
    do {
      if (0 < fd[num_open_0]) {
        close(fd[num_open_0]);
      }
      num_open_0 = num_open_0 + 1;
    } while (num_open_0 < num_open_1);
  }
  free(fd);
  fd = (int *)0x0;
  return;
}

Assistant:

static void close_file_descriptors(void)
{
  for(num_open.rlim_cur = 0;
      num_open.rlim_cur < num_open.rlim_max;
      num_open.rlim_cur++)
    if(fd[num_open.rlim_cur] > 0)
      close(fd[num_open.rlim_cur]);
  free(fd);
  fd = NULL;
}